

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

char * __thiscall NULLCString::strchr(NULLCString *this,char *__s,int __c)

{
  char *pcVar1;
  
  if (this == (NULLCString *)0x0) {
    pcVar1 = "second string is null";
  }
  else {
    if (((int)__s != 0) && (this[(int)__s - 1] == (NULLCString)0x0)) {
      pcVar1 = ::strchr((char *)this,(int)(char)__c);
      return (char *)(ulong)(-(uint)(pcVar1 == (char *)0x0) | (int)pcVar1 - (int)this);
    }
    pcVar1 = "second string is not null-terminated";
  }
  nullcThrowError(pcVar1 + 7);
  return (char *)0xffffffff;
}

Assistant:

int strchr(NULLCArray string, char ch)
	{
		if(!string.ptr)
		{
			nullcThrowError("string is null");
			return -1;
		}

		if(string.len == 0 || string.ptr[string.len - 1])
		{
			nullcThrowError("string is not null-terminated");
			return -1;
		}

		if(const char *pos = ::strchr(string.ptr, ch))
			return int(pos - string.ptr);

		return -1;
	}